

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_interfaces.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::GetLocationsForVariable
          (ValidationState_t *_,Instruction *entry_point,Instruction *variable,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *locations,
          unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
          *output_index1_locations)

{
  uint16_t uVar1;
  _Rb_tree_color _Var2;
  long *plVar3;
  _Hash_node_base *p_Var4;
  uint uVar5;
  byte bVar6;
  _Tuple_impl<1UL,_bool,_unsigned_int> _Var7;
  byte bVar8;
  ExecutionModel EVar9;
  StorageClass SVar10;
  uint uVar11;
  _Head_base<2UL,_unsigned_int,_false> _Var12;
  spv_result_t sVar13;
  spv_result_t sVar14;
  uint32_t uVar15;
  int iVar16;
  Instruction *pIVar17;
  mapped_type *pmVar18;
  _Base_ptr p_Var19;
  _Rb_tree_color *p_Var20;
  mapped_type *pmVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  mapped_type mVar27;
  _Rb_tree_header *p_Var28;
  key_type kVar29;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *p_Var30;
  char *pcVar31;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  *this;
  undefined1 *puVar32;
  _Rb_tree_color _Var33;
  size_t index;
  _Tuple_impl<2UL,_unsigned_int> _Var34;
  __hash_code __code_2;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  pair<std::__detail::_Node_iterator<unsigned_int,_true,_false>,_bool> pVar38;
  uint32_t check;
  uint32_t num_locations_1;
  string storage_class;
  __hashtable *__h;
  unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  member_locations;
  uint32_t num_locations;
  uint local_31c;
  char local_315;
  _Head_base<2UL,_unsigned_int,_false> local_314;
  Instruction *local_310;
  _Tuple_impl<1UL,_bool,_unsigned_int> local_308;
  uint32_t local_2fc;
  ulong local_2f8;
  ulong local_2f0;
  undefined8 local_2e8;
  Instruction *local_2e0;
  Instruction *local_2d8;
  long *local_2d0;
  long local_2c8;
  long local_2c0 [2];
  _Tuple_impl<1UL,_bool,_unsigned_int> local_2b0;
  ulong local_2a8;
  string local_2a0;
  undefined1 local_280 [32];
  float local_260;
  size_t local_258;
  __node_base_ptr p_Stack_250;
  map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
  *local_248;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_240;
  undefined1 local_208 [5];
  char cStack_203;
  spv_result_t local_38;
  
  uVar23 = 0;
  local_308 = (_Tuple_impl<1UL,_bool,_unsigned_int>)output_index1_locations;
  local_2d8 = entry_point;
  EVar9 = Instruction::GetOperandAs<spv::ExecutionModel>(entry_point,0);
  SVar10 = Instruction::GetOperandAs<spv::StorageClass>(variable,2);
  uVar11 = Instruction::GetOperandAs<unsigned_int>(variable,0);
  pIVar17 = ValidationState_t::FindDef(_,uVar11);
  local_314._M_head_impl = Instruction::GetOperandAs<unsigned_int>(pIVar17,2);
  local_310 = ValidationState_t::FindDef(_,local_314._M_head_impl);
  local_208._0_4_ = (variable->inst_).result_id;
  local_248 = &_->id_decorations_;
  local_2e0 = variable;
  pmVar18 = std::
            map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
            ::operator[](local_248,(key_type *)local_208);
  p_Var19 = (pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var28 = &(pmVar18->_M_t)._M_impl.super__Rb_tree_header;
  local_2b0 = (_Tuple_impl<1UL,_bool,_unsigned_int>)locations;
  if ((_Rb_tree_header *)p_Var19 == p_Var28) {
    bVar6 = 0;
    bVar8 = 0;
    bVar37 = false;
    local_2e8 = (ulong)local_2e8._4_4_ << 0x20;
    local_2f0 = 0;
    local_308 = (_Tuple_impl<1UL,_bool,_unsigned_int>)locations;
  }
  else {
    local_2a8 = CONCAT44(local_2a8._4_4_,EVar9);
    local_315 = EVar9 != ExecutionModelFragment || SVar10 != Output;
    local_2f0 = 0;
    local_2e8 = (ulong)local_2e8._4_4_ << 0x20;
    uVar23 = 0;
    bVar36 = false;
    _Var33 = _S_red;
    bVar37 = false;
    local_2f8 = 0;
    bVar6 = 0;
    do {
      _Var2 = p_Var19[1]._M_color;
      if ((int)_Var2 < 0x20) {
        if ((int)_Var2 < 0x1e) {
          if (_Var2 == 0xf) {
            bVar37 = true;
          }
          else if (_Var2 == 0xb) {
            return SPV_SUCCESS;
          }
        }
        else if (_Var2 == 0x1e) {
          _Var2 = (p_Var19[1]._M_parent)->_M_color;
          local_2e8 = CONCAT44(local_2e8._4_4_,_Var2);
          local_2f0 = CONCAT71((uint7)(uint3)(_Var2 >> 8),1);
        }
        else if (_Var2 == 0x1f) {
          uVar23 = (ulong)(p_Var19[1]._M_parent)->_M_color;
        }
      }
      else if (_Var2 == 0x20) {
        if (local_315 != '\0') {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_2e0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,"Index can only be applied to Fragment output variables",
                     0x36);
          sVar14 = local_38;
          goto LAB_00186424;
        }
        _Var33 = (p_Var19[1]._M_parent)->_M_color;
        bVar36 = true;
      }
      else if (_Var2 == 0x1499) {
        local_2f8 = 0x1401;
      }
      else if (_Var2 == 0x14a5) {
        if ((int)local_2a8 != 4) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_2e0);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_280,_,0x1a79,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_280._0_8_,local_280._8_8_);
          pcVar31 = "PerVertexKHR can only be applied to Fragment Execution Models";
          lVar26 = 0x3d;
          goto LAB_001863ee;
        }
        bVar6 = 1;
        if (((local_310->inst_).opcode & 0xfffe) != 0x1c) {
          ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_2e0);
          ValidationState_t::VkErrorID_abi_cxx11_((string *)local_280,_,0x1a7a,(char *)0x0);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_208,(char *)local_280._0_8_,local_280._8_8_);
          pcVar31 = "PerVertexKHR must be declared as arrays";
          lVar26 = 0x27;
          goto LAB_001863ee;
        }
      }
      p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
    } while ((_Rb_tree_header *)p_Var19 != p_Var28);
    if (_Var33 != _S_black) {
      local_308 = local_2b0;
    }
    if (!bVar36) {
      local_308 = local_2b0;
    }
    bVar8 = (byte)local_2f8;
  }
  EVar9 = Instruction::GetOperandAs<spv::ExecutionModel>(local_2d8,0);
  pIVar17 = local_310;
  _Var12._M_head_impl = local_314._M_head_impl;
  local_2f8 = uVar23;
  switch(EVar9) {
  case ExecutionModelTessellationControl:
    bVar37 = !bVar37;
    break;
  case ExecutionModelTessellationEvaluation:
    bVar8 = SVar10 == Output | bVar37;
LAB_00186274:
    bVar37 = (bVar8 & 1) == 0;
    break;
  case ExecutionModelGeometry:
    bVar37 = SVar10 == Output;
    goto LAB_00186256;
  case ExecutionModelFragment:
    bVar37 = !(bool)(SVar10 != Output & bVar6);
LAB_00186256:
    if (!bVar37) goto LAB_00186282;
    goto LAB_001862ac;
  default:
    if (EVar9 == ExecutionModelMeshNV) {
      bVar8 = SVar10 != Output | bVar8;
      goto LAB_00186274;
    }
    goto LAB_001862ac;
  }
  if (bVar37) {
LAB_00186282:
    if (((local_310->inst_).opcode & 0xfffe) == 0x1c) {
      _Var12._M_head_impl = Instruction::GetOperandAs<unsigned_int>(local_310,1);
      pIVar17 = ValidationState_t::FindDef(_,_Var12._M_head_impl);
    }
  }
LAB_001862ac:
  if (((pIVar17->inst_).opcode == 0x1e) &&
     (bVar37 = ValidationState_t::HasDecoration(_,_Var12._M_head_impl,BuiltIn), bVar37)) {
    return SPV_SUCCESS;
  }
  bVar37 = ValidationState_t::HasDecoration(_,_Var12._M_head_impl,Block);
  uVar23 = local_2f0;
  if (!bVar37 && (local_2f0 & 1) == 0) {
    uVar1 = (pIVar17->inst_).opcode;
    ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_2e0);
    ValidationState_t::VkErrorID_abi_cxx11_
              ((string *)local_280,_,uVar1 == 0x1e | 0x1334,(char *)0x0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_208,(char *)local_280._0_8_,local_280._8_8_);
    pcVar31 = "Variable must be decorated with a location";
    lVar26 = 0x2a;
LAB_001863ee:
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,pcVar31,lVar26);
    sVar14 = local_38;
    if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
      operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
    }
LAB_00186424:
    DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
    return sVar14;
  }
  p_Var30 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
             *)(ulong)_Var12._M_head_impl;
  pcVar31 = "output";
  if (SVar10 != Output) {
    pcVar31 = "input";
  }
  local_2d0 = local_2c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_2d0,pcVar31,pcVar31 + (6 - (ulong)(SVar10 != Output)));
  if ((uVar23 & 1) == 0) {
    local_280._0_8_ = &p_Stack_250;
    local_280._8_8_ = 1;
    local_280._16_8_ = 0;
    local_280._24_8_ = 0;
    local_260 = 1.0;
    local_258 = 0;
    p_Stack_250 = (__node_base_ptr)0x0;
    local_240._M_buckets = &local_240._M_single_bucket;
    local_240._M_bucket_count = 1;
    local_240._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
    local_240._M_element_count = 0;
    local_240._M_rehash_policy._M_max_load_factor = 1.0;
    local_240._M_rehash_policy._M_next_resize = 0;
    local_240._M_single_bucket = (__node_base_ptr)0x0;
    local_208._0_4_ = _Var12._M_head_impl;
    local_310 = pIVar17;
    pmVar18 = std::
              map<unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<spvtools::val::Decoration,_std::less<spvtools::val::Decoration>,_std::allocator<spvtools::val::Decoration>_>_>_>_>
              ::operator[](local_248,(key_type *)local_208);
    p_Var19 = (pmVar18->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var28 = &(pmVar18->_M_t)._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var19 != p_Var28) {
      p_Var30 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                 *)local_280;
      do {
        if (p_Var19[1]._M_color == 0x1f) {
          _Var12._M_head_impl = p_Var19[2]._M_color;
          if (local_240._M_buckets[(ulong)_Var12._M_head_impl % local_240._M_bucket_count] !=
              (__node_base_ptr)0x0) {
            p_Var4 = local_240._M_buckets[(ulong)_Var12._M_head_impl % local_240._M_bucket_count]->
                     _M_nxt;
            _Var33 = *(_Rb_tree_color *)&p_Var4[1]._M_nxt;
            do {
              if (_Var12._M_head_impl == _Var33) {
                if (*(_Rb_tree_color *)((long)&p_Var4[1]._M_nxt + 4) ==
                    (p_Var19[1]._M_parent)->_M_color) goto LAB_001865c4;
                ValidationState_t::diag
                          ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_310);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"Member index ",0xd);
                std::ostream::operator<<((DiagnosticStream *)local_208,p_Var19[2]._M_color);
                pcVar31 = " has conflicting component assignments";
                lVar26 = 0x26;
                goto LAB_00186cbe;
              }
              p_Var4 = p_Var4->_M_nxt;
            } while ((p_Var4 != (_Hash_node_base *)0x0) &&
                    (_Var33 = *(_Rb_tree_color *)&p_Var4[1]._M_nxt,
                    (ulong)_Var33 % local_240._M_bucket_count ==
                    (ulong)_Var12._M_head_impl % local_240._M_bucket_count));
          }
          _Var33 = (p_Var19[1]._M_parent)->_M_color;
          this = &local_240;
LAB_001865b9:
          local_208._0_4_ = _Var12._M_head_impl;
          p_Var20 = std::__detail::
                    _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                    ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                  *)this,(key_type *)local_208);
          *p_Var20 = _Var33;
        }
        else if (p_Var19[1]._M_color == 0x1e) {
          _Var12._M_head_impl = p_Var19[2]._M_color;
          if (*(long **)(local_280._0_8_ + ((ulong)_Var12._M_head_impl % (ulong)local_280._8_8_) * 8
                        ) != (long *)0x0) {
            plVar3 = (long *)**(long **)(local_280._0_8_ +
                                        ((ulong)_Var12._M_head_impl % (ulong)local_280._8_8_) * 8);
            _Var33 = *(_Rb_tree_color *)(plVar3 + 1);
joined_r0x001864fe:
            if (_Var12._M_head_impl != _Var33) goto LAB_00186500;
            if (*(_Rb_tree_color *)((long)plVar3 + 0xc) != (p_Var19[1]._M_parent)->_M_color) {
              ValidationState_t::diag
                        ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_310);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,"Member index ",0xd);
              std::ostream::operator<<((DiagnosticStream *)local_208,p_Var19[2]._M_color);
              pcVar31 = " has conflicting location assignments";
              lVar26 = 0x25;
LAB_00186cbe:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_208,pcVar31,lVar26);
              sVar14 = local_38;
              goto LAB_00186ccf;
            }
            goto LAB_001865c4;
          }
LAB_00186595:
          _Var33 = (p_Var19[1]._M_parent)->_M_color;
          this = p_Var30;
          goto LAB_001865b9;
        }
LAB_001865c4:
        p_Var19 = (_Base_ptr)std::_Rb_tree_increment(p_Var19);
      } while ((_Rb_tree_header *)p_Var19 != p_Var28);
    }
    sVar14 = (spv_result_t)p_Var30;
    bVar37 = true;
    if (0x10 < (ulong)((long)(local_310->operands_).
                             super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(local_310->operands_).
                            super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>
                            ._M_impl.super__Vector_impl_data._M_start)) {
      index = 1;
LAB_001865fe:
      _Var34.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
           (_Head_base<2UL,_unsigned_int,_false>)((int)index - 1);
      uVar23 = (ulong)(uint)_Var34.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl %
               (ulong)local_280._8_8_;
      if (*(long **)(local_280._0_8_ + uVar23 * 8) == (long *)0x0) {
LAB_00186a70:
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_310);
        ValidationState_t::VkErrorID_abi_cxx11_(&local_2a0,_,0x1337,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,
                                    (uint)local_2a0._M_dataplus._M_p),local_2a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,"Member index ",0xd)
        ;
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," is missing a location assignment",0x21);
        sVar14 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint)local_2a0._M_dataplus._M_p) !=
            &local_2a0.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint)local_2a0._M_dataplus._M_p
                                  ),local_2a0.field_2._M_allocated_capacity + 1);
        }
LAB_00186ccf:
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        bVar37 = false;
      }
      else {
        plVar3 = (long *)**(long **)(local_280._0_8_ + uVar23 * 8);
        _Var12._M_head_impl = *(uint *)(plVar3 + 1);
        while (_Var34.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl !=
               (_Head_base<2UL,_unsigned_int,_false>)_Var12._M_head_impl) {
          plVar3 = (long *)*plVar3;
          if ((plVar3 == (long *)0x0) ||
             (_Var12._M_head_impl = *(uint *)(plVar3 + 1),
             (ulong)_Var12._M_head_impl % (ulong)local_280._8_8_ != uVar23)) goto LAB_00186a70;
        }
        local_2f0 = (ulong)*(uint *)((long)plVar3 + 0xc);
        uVar11 = Instruction::GetOperandAs<unsigned_int>(local_310,index);
        pIVar17 = ValidationState_t::FindDef(_,uVar11);
        local_2fc = 0;
        sVar13 = NumConsumedLocations(_,pIVar17,&local_2fc);
        p_Var30 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((ulong)p_Var30 & 0xffffffff);
        if (sVar13 != SPV_SUCCESS) {
          p_Var30 = (_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                     *)(ulong)(uint)sVar13;
        }
        sVar14 = (spv_result_t)p_Var30;
        if (sVar13 == SPV_SUCCESS) goto code_r0x001866a1;
LAB_00186ee6:
        bVar37 = false;
        sVar14 = sVar13;
      }
    }
LAB_00186cdc:
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable(&local_240);
    std::
    _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)local_280);
    if (!bVar37) goto LAB_00186cfd;
  }
  else {
    _Var12._M_head_impl = 1;
    if ((pIVar17->inst_).opcode == 0x1c) {
      uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar17,2);
      ValidationState_t::EvalInt32IfConst((tuple<bool,_bool,_unsigned_int> *)local_208,_,uVar11);
      if ((cStack_203 == '\x01') && (local_208[4] != false)) {
        _Var12._M_head_impl = local_208._0_4_;
      }
      else {
        _Var12._M_head_impl = 1;
      }
      uVar11 = Instruction::GetOperandAs<unsigned_int>(pIVar17,1);
      pIVar17 = ValidationState_t::FindDef(_,uVar11);
    }
    local_240._M_buckets = (__buckets_ptr)((ulong)local_240._M_buckets._4_4_ << 0x20);
    sVar14 = NumConsumedLocations(_,pIVar17,(uint32_t *)&local_240);
    if (sVar14 != SPV_SUCCESS) goto LAB_00186cfd;
    uVar15 = NumConsumedComponents(_,pIVar17);
    if (_Var12._M_head_impl != 0) {
      kVar29 = 0;
      do {
        iVar16 = (int)local_240._M_buckets * kVar29 + (int)local_2e8;
        uVar11 = iVar16 * 4;
        if (0x3fff < uVar11) break;
        local_2a0._M_dataplus._M_p._0_4_ = (int)local_2f8 + uVar11;
        uVar22 = (uint)local_2a0._M_dataplus._M_p + uVar15;
        if (uVar15 == 0) {
          local_2a0._M_dataplus._M_p._0_4_ = uVar11;
          uVar22 = (iVar16 + (int)local_240._M_buckets) * 4;
        }
        for (; (uint)local_2a0._M_dataplus._M_p < uVar22;
            local_2a0._M_dataplus._M_p._0_4_ = (uint)local_2a0._M_dataplus._M_p + 1) {
          _local_208 = local_308;
          pVar38 = std::
                   _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                   ::
                   _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                             ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                               *)local_308,&local_2a0,local_208);
          if (((undefined1  [16])pVar38 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
            ValidationState_t::diag
                      ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_2d8);
            ValidationState_t::VkErrorID_abi_cxx11_
                      ((string *)local_280,_,(SVar10 == Output) + 0x2211,(char *)0x0);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_280._0_8_,local_280._8_8_);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,"Entry-point has conflicting ",0x1c);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,(char *)local_2d0,local_2c8);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208," location assignment at location ",0x21);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_208,", component ",0xc);
            std::ostream::_M_insert<unsigned_long>((ulong)local_208);
            if ((undefined1 *)local_280._0_8_ != local_280 + 0x10) {
              operator_delete((void *)local_280._0_8_,local_280._16_8_ + 1);
            }
            DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
            sVar14 = local_38;
            goto LAB_00186cfd;
          }
        }
        kVar29 = kVar29 + 1;
      } while (kVar29 != _Var12._M_head_impl);
    }
  }
  sVar14 = SPV_SUCCESS;
LAB_00186cfd:
  if (local_2d0 != local_2c0) {
    operator_delete(local_2d0,local_2c0[0] + 1);
  }
  return sVar14;
LAB_00186500:
  plVar3 = (long *)*plVar3;
  if ((plVar3 == (long *)0x0) ||
     (_Var33 = *(_Rb_tree_color *)(plVar3 + 1),
     (ulong)_Var33 % (ulong)local_280._8_8_ != (ulong)_Var12._M_head_impl % (ulong)local_280._8_8_))
  goto LAB_00186595;
  goto joined_r0x001864fe;
code_r0x001866a1:
  uVar15 = NumConsumedComponents(_,pIVar17);
  uVar23 = (ulong)uVar15;
  uVar24 = (ulong)(uint)_Var34.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl %
           local_240._M_bucket_count;
  if (local_240._M_buckets[uVar24] == (__node_base_ptr)0x0) {
LAB_00186723:
    mVar27 = 0;
  }
  else {
    p_Var4 = local_240._M_buckets[uVar24]->_M_nxt;
    _Var12._M_head_impl = *(uint *)&p_Var4[1]._M_nxt;
    do {
      if (_Var34.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl ==
          (_Head_base<2UL,_unsigned_int,_false>)_Var12._M_head_impl) {
        local_208._0_4_ = _Var34.super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
        pmVar21 = std::__detail::
                  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&local_240,(key_type *)local_208);
        mVar27 = *pmVar21;
        break;
      }
      p_Var4 = p_Var4->_M_nxt;
      if (p_Var4 == (_Hash_node_base *)0x0) goto LAB_00186723;
      _Var12._M_head_impl = *(uint *)&p_Var4[1]._M_nxt;
      mVar27 = 0;
    } while ((ulong)_Var12._M_head_impl % local_240._M_bucket_count == uVar24);
  }
  _Var7 = local_2b0;
  uVar11 = (uint)local_2f0;
  uVar22 = uVar11 * 4;
  if (uVar22 < 0x4000) {
    if ((uVar15 - 1 < 3) && ((pIVar17->inst_).opcode == 0x1c)) {
      if (uVar11 < local_2fc + uVar11) {
        uVar11 = uVar15 + mVar27;
        uVar35 = (ulong)mVar27;
        uVar25 = local_2f0 & 0xffffffff;
        local_2f8 = CONCAT44(local_2f8._4_4_,uVar11);
        uVar24 = local_2f0;
        uVar15 = local_2fc;
        local_2e8 = uVar23;
        local_2a8 = uVar35;
        do {
          _Var12._M_head_impl = (uint)(uint)uVar25;
          if (mVar27 < uVar11) {
            local_308.super__Tuple_impl<2UL,_unsigned_int>.
            super__Head_base<2UL,_unsigned_int,_false>._M_head_impl =
                 (_Head_base<2UL,_unsigned_int,_false>)(uint)uVar25;
            uVar23 = uVar23 & 0xffffffff;
            do {
              local_31c = uVar22 + (int)uVar35;
              _local_208 = local_2b0;
              pVar38 = std::
                       _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                       ::
                       _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                                 ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                                   *)local_2b0,&local_31c,local_208);
              if (((undefined1  [16])pVar38 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
                ValidationState_t::diag
                          ((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_2d8);
                ValidationState_t::VkErrorID_abi_cxx11_
                          (&local_2a0,_,(SVar10 == Output) + 0x2211,(char *)0x0);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,
                           (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,
                                            (uint)local_2a0._M_dataplus._M_p),
                           local_2a0._M_string_length);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,"Entry-point has conflicting ",0x1c);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,(char *)local_2d0,local_2c8);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208," location assignment at location ",0x21);
                std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_208,", component ",0xc);
                std::ostream::_M_insert<unsigned_long>((ulong)local_208);
                puVar32 = (undefined1 *)
                          CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint)local_2a0._M_dataplus._M_p
                                  );
                sVar13 = local_38;
                goto LAB_00186ebc;
              }
              uVar35 = uVar35 + 1;
              uVar11 = (int)uVar23 - 1;
              uVar23 = (ulong)uVar11;
            } while (uVar11 != 0);
            uVar24 = local_2f0;
            uVar23 = local_2e8;
            uVar35 = local_2a8;
            uVar11 = (uint)local_2f8;
            _Var12 = local_308.super__Tuple_impl<2UL,_unsigned_int>.
                     super__Head_base<2UL,_unsigned_int,_false>._M_head_impl;
            uVar15 = local_2fc;
          }
          uVar25 = (ulong)(_Var12._M_head_impl + 1);
          uVar22 = uVar22 + 4;
        } while (_Var12._M_head_impl + 1 < uVar15 + (int)uVar24);
      }
    }
    else {
      uVar5 = mVar27 + uVar22 + uVar15;
      local_31c = mVar27 + uVar22;
      if (uVar15 == 0) {
        uVar5 = (local_2fc + uVar11) * 4;
        local_31c = uVar22;
      }
      if (local_31c < uVar5) {
LAB_00186842:
        _local_208 = _Var7;
        pVar38 = std::
                 _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 ::
                 _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                           ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                             *)_Var7,&local_31c,local_208);
        if (((undefined1  [16])pVar38 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
        goto code_r0x00186868;
        ValidationState_t::diag((DiagnosticStream *)local_208,_,SPV_ERROR_INVALID_DATA,local_2d8);
        ValidationState_t::VkErrorID_abi_cxx11_
                  (&local_2a0,_,(SVar10 == Output) + 0x2211,(char *)0x0);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,
                   (char *)CONCAT44(local_2a0._M_dataplus._M_p._4_4_,
                                    (uint)local_2a0._M_dataplus._M_p),local_2a0._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,"Entry-point has conflicting ",0x1c);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208,(char *)local_2d0,local_2c8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_208," location assignment at location ",0x21);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_208,", component ",0xc);
        std::ostream::_M_insert<unsigned_long>((ulong)local_208);
        puVar32 = (undefined1 *)
                  CONCAT44(local_2a0._M_dataplus._M_p._4_4_,(uint)local_2a0._M_dataplus._M_p);
        sVar13 = local_38;
LAB_00186ebc:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)puVar32 != &local_2a0.field_2) {
          operator_delete(puVar32,local_2a0.field_2._M_allocated_capacity + 1);
        }
        DiagnosticStream::~DiagnosticStream((DiagnosticStream *)local_208);
        goto LAB_00186ee6;
      }
    }
  }
LAB_00186739:
  bVar37 = true;
  index = (size_t)((int)index + 1);
  if ((ulong)((long)(local_310->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_finish -
              (long)(local_310->operands_).
                    super__Vector_base<spv_parsed_operand_t,_std::allocator<spv_parsed_operand_t>_>.
                    _M_impl.super__Vector_impl_data._M_start >> 4) <= index) goto LAB_00186cdc;
  goto LAB_001865fe;
code_r0x00186868:
  local_31c = local_31c + 1;
  if (uVar5 <= local_31c) goto LAB_00186739;
  goto LAB_00186842;
}

Assistant:

spv_result_t GetLocationsForVariable(
    ValidationState_t& _, const Instruction* entry_point,
    const Instruction* variable, std::unordered_set<uint32_t>* locations,
    std::unordered_set<uint32_t>* output_index1_locations) {
  const bool is_fragment = entry_point->GetOperandAs<spv::ExecutionModel>(0) ==
                           spv::ExecutionModel::Fragment;
  const auto sc_index = 2u;
  const bool is_output = variable->GetOperandAs<spv::StorageClass>(sc_index) ==
                         spv::StorageClass::Output;
  auto ptr_type_id = variable->GetOperandAs<uint32_t>(0);
  auto ptr_type = _.FindDef(ptr_type_id);
  auto type_id = ptr_type->GetOperandAs<uint32_t>(2);
  auto type = _.FindDef(type_id);

  // Check for Location, Component and Index decorations on the variable. The
  // validator allows duplicate decorations if the location/component/index are
  // equal. Also track Patch and PerTaskNV decorations.
  bool has_location = false;
  uint32_t location = 0;
  uint32_t component = 0;
  bool has_index = false;
  uint32_t index = 0;
  bool has_patch = false;
  bool has_per_task_nv = false;
  bool has_per_vertex_khr = false;
  // Duplicate Location, Component, Index are checked elsewhere.
  for (auto& dec : _.id_decorations(variable->id())) {
    if (dec.dec_type() == spv::Decoration::Location) {
      has_location = true;
      location = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Component) {
      component = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::Index) {
      if (!is_output || !is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << "Index can only be applied to Fragment output variables";
      }
      has_index = true;
      index = dec.params()[0];
    } else if (dec.dec_type() == spv::Decoration::BuiltIn) {
      // Don't check built-ins.
      return SPV_SUCCESS;
    } else if (dec.dec_type() == spv::Decoration::Patch) {
      has_patch = true;
    } else if (dec.dec_type() == spv::Decoration::PerTaskNV) {
      has_per_task_nv = true;
    } else if (dec.dec_type() == spv::Decoration::PerVertexKHR) {
      if (!is_fragment) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6777)
               << "PerVertexKHR can only be applied to Fragment Execution "
                  "Models";
      }
      if (type->opcode() != spv::Op::OpTypeArray &&
          type->opcode() != spv::Op::OpTypeRuntimeArray) {
        return _.diag(SPV_ERROR_INVALID_DATA, variable)
               << _.VkErrorID(6778)
               << "PerVertexKHR must be declared as arrays";
      }
      has_per_vertex_khr = true;
    }
  }

  // Vulkan 14.1.3: Tessellation control and mesh per-vertex outputs and
  // tessellation control, evaluation and geometry per-vertex inputs have a
  // layer of arraying that is not included in interface matching.
  bool is_arrayed = false;
  switch (entry_point->GetOperandAs<spv::ExecutionModel>(0)) {
    case spv::ExecutionModel::TessellationControl:
      if (!has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::TessellationEvaluation:
      if (!is_output && !has_patch) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Geometry:
      if (!is_output) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::Fragment:
      if (!is_output && has_per_vertex_khr) {
        is_arrayed = true;
      }
      break;
    case spv::ExecutionModel::MeshNV:
      if (is_output && !has_per_task_nv) {
        is_arrayed = true;
      }
      break;
    default:
      break;
  }

  // Unpack arrayness.
  if (is_arrayed && (type->opcode() == spv::Op::OpTypeArray ||
                     type->opcode() == spv::Op::OpTypeRuntimeArray)) {
    type_id = type->GetOperandAs<uint32_t>(1);
    type = _.FindDef(type_id);
  }

  if (type->opcode() == spv::Op::OpTypeStruct) {
    // Don't check built-ins.
    if (_.HasDecoration(type_id, spv::Decoration::BuiltIn)) return SPV_SUCCESS;
  }

  // Only block-decorated structs don't need a location on the variable.
  const bool is_block = _.HasDecoration(type_id, spv::Decoration::Block);
  if (!has_location && !is_block) {
    const auto vuid = (type->opcode() == spv::Op::OpTypeStruct) ? 4917 : 4916;
    return _.diag(SPV_ERROR_INVALID_DATA, variable)
           << _.VkErrorID(vuid) << "Variable must be decorated with a location";
  }

  const std::string storage_class = is_output ? "output" : "input";
  if (has_location) {
    auto sub_type = type;
    bool is_int = false;
    bool is_const = false;
    uint32_t array_size = 1;
    // If the variable is still arrayed, mark the locations/components per
    // index.
    if (type->opcode() == spv::Op::OpTypeArray) {
      // Determine the array size if possible and get the element type.
      std::tie(is_int, is_const, array_size) =
          _.EvalInt32IfConst(type->GetOperandAs<uint32_t>(2));
      if (!is_int || !is_const) array_size = 1;
      auto sub_type_id = type->GetOperandAs<uint32_t>(1);
      sub_type = _.FindDef(sub_type_id);
    }

    uint32_t num_locations = 0;
    if (auto error = NumConsumedLocations(_, sub_type, &num_locations))
      return error;
    uint32_t num_components = NumConsumedComponents(_, sub_type);

    for (uint32_t array_idx = 0; array_idx < array_size; ++array_idx) {
      uint32_t array_location = location + (num_locations * array_idx);
      uint32_t start = array_location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        break;
      }

      uint32_t end = (array_location + num_locations) * 4;
      if (num_components != 0) {
        start += component;
        end = array_location * 4 + component + num_components;
      }

      auto locs = locations;
      if (has_index && index == 1) locs = output_index1_locations;

      for (uint32_t i = start; i < end; ++i) {
        if (!locs->insert(i).second) {
          return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                 << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                 << "Entry-point has conflicting " << storage_class
                 << " location assignment at location " << i / 4
                 << ", component " << i % 4;
        }
      }
    }
  } else {
    // For Block-decorated structs with no location assigned to the variable,
    // each member of the block must be assigned a location. Also record any
    // member component assignments. The validator allows duplicate decorations
    // if they agree on the location/component.
    std::unordered_map<uint32_t, uint32_t> member_locations;
    std::unordered_map<uint32_t, uint32_t> member_components;
    for (auto& dec : _.id_decorations(type_id)) {
      if (dec.dec_type() == spv::Decoration::Location) {
        auto where = member_locations.find(dec.struct_member_index());
        if (where == member_locations.end()) {
          member_locations[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting location assignments";
        }
      } else if (dec.dec_type() == spv::Decoration::Component) {
        auto where = member_components.find(dec.struct_member_index());
        if (where == member_components.end()) {
          member_components[dec.struct_member_index()] = dec.params()[0];
        } else if (where->second != dec.params()[0]) {
          return _.diag(SPV_ERROR_INVALID_DATA, type)
                 << "Member index " << dec.struct_member_index()
                 << " has conflicting component assignments";
        }
      }
    }

    for (uint32_t i = 1; i < type->operands().size(); ++i) {
      auto where = member_locations.find(i - 1);
      if (where == member_locations.end()) {
        return _.diag(SPV_ERROR_INVALID_DATA, type)
               << _.VkErrorID(4919) << "Member index " << i - 1
               << " is missing a location assignment";
      }

      location = where->second;
      auto member = _.FindDef(type->GetOperandAs<uint32_t>(i));
      uint32_t num_locations = 0;
      if (auto error = NumConsumedLocations(_, member, &num_locations))
        return error;

      // If the component is not specified, it is assumed to be zero.
      uint32_t num_components = NumConsumedComponents(_, member);
      component = 0;
      if (member_components.count(i - 1)) {
        component = member_components[i - 1];
      }

      uint32_t start = location * 4;
      if (kMaxLocations <= start) {
        // Too many locations, give up.
        continue;
      }

      if (member->opcode() == spv::Op::OpTypeArray && num_components >= 1 &&
          num_components < 4) {
        // When an array has an element that takes less than a location in
        // size, calculate the used locations in a strided manner.
        for (uint32_t l = location; l < num_locations + location; ++l) {
          for (uint32_t c = component; c < component + num_components; ++c) {
            uint32_t check = 4 * l + c;
            if (!locations->insert(check).second) {
              return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                     << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                     << "Entry-point has conflicting " << storage_class
                     << " location assignment at location " << l
                     << ", component " << c;
            }
          }
        }
      } else {
        // TODO: There is a hole here is the member is an array of 3- or
        // 4-element vectors of 64-bit types.
        uint32_t end = (location + num_locations) * 4;
        if (num_components != 0) {
          start += component;
          end = location * 4 + component + num_components;
        }
        for (uint32_t l = start; l < end; ++l) {
          if (!locations->insert(l).second) {
            return _.diag(SPV_ERROR_INVALID_DATA, entry_point)
                   << (is_output ? _.VkErrorID(8722) : _.VkErrorID(8721))
                   << "Entry-point has conflicting " << storage_class
                   << " location assignment at location " << l / 4
                   << ", component " << l % 4;
          }
        }
      }
    }
  }

  return SPV_SUCCESS;
}